

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCompressedTexture.cpp
# Opt level: O0

CompressedTexFormat tcu::getAstcFormatByBlockSize(IVec3 *size,bool isSRGB)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  InternalError *pIVar4;
  int local_17c;
  string local_178;
  int local_154;
  string local_150;
  int local_12c;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  Vector<int,_3> local_64;
  CompressedTexFormat local_58;
  CompressedTexFormat local_54;
  CompressedTexFormat fmt;
  int fmtI;
  allocator<char> local_39;
  string local_38;
  byte local_11;
  IVec3 *pIStack_10;
  bool isSRGB_local;
  IVec3 *size_local;
  
  local_11 = isSRGB;
  pIStack_10 = size;
  iVar3 = Vector<int,_3>::z(size);
  if (1 < iVar3) {
    fmt._3_1_ = 1;
    pIVar4 = (InternalError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"3D ASTC textures not currently supported",&local_39);
    InternalError::InternalError(pIVar4,&local_38);
    fmt._3_1_ = COMPRESSEDTEXFORMAT_ETC1_RGB8 >> 0x18;
    __cxa_throw(pIVar4,&InternalError::typeinfo,InternalError::~InternalError);
  }
  local_54 = COMPRESSEDTEXFORMAT_ETC1_RGB8;
  while( true ) {
    if (0x26 < (int)local_54) {
      pIVar4 = (InternalError *)__cxa_allocate_exception(0x38);
      local_12c = Vector<int,_3>::x(pIStack_10);
      de::toString<int>(&local_128,&local_12c);
      std::operator+(&local_108,"Invalid ASTC block size ",&local_128);
      std::operator+(&local_e8,&local_108,"x");
      local_154 = Vector<int,_3>::y(pIStack_10);
      de::toString<int>(&local_150,&local_154);
      std::operator+(&local_c8,&local_e8,&local_150);
      std::operator+(&local_a8,&local_c8,"x");
      local_17c = Vector<int,_3>::z(pIStack_10);
      de::toString<int>(&local_178,&local_17c);
      std::operator+(&local_88,&local_a8,&local_178);
      InternalError::InternalError(pIVar4,&local_88);
      __cxa_throw(pIVar4,&InternalError::typeinfo,InternalError::~InternalError);
    }
    local_58 = local_54;
    bVar1 = isAstcFormat(local_54);
    bVar2 = false;
    if (bVar1) {
      getBlockPixelSize((tcu *)&local_64,local_58);
      bVar1 = Vector<int,_3>::operator==(&local_64,pIStack_10);
      bVar2 = false;
      if (bVar1) {
        bVar2 = isAstcSRGBFormat(local_58);
        bVar2 = bVar2 == (bool)(local_11 & 1);
      }
    }
    if (bVar2) break;
    local_54 = local_54 + COMPRESSEDTEXFORMAT_EAC_R11;
  }
  return local_58;
}

Assistant:

CompressedTexFormat getAstcFormatByBlockSize (const IVec3& size, bool isSRGB)
{
	if (size.z() > 1)
		throw InternalError("3D ASTC textures not currently supported");

	for (int fmtI = 0; fmtI < COMPRESSEDTEXFORMAT_LAST; fmtI++)
	{
		const CompressedTexFormat fmt = (CompressedTexFormat)fmtI;

		if (isAstcFormat(fmt) && getBlockPixelSize(fmt) == size && isAstcSRGBFormat(fmt) == isSRGB)
			return fmt;
	}

	throw InternalError("Invalid ASTC block size " + de::toString(size.x()) + "x" + de::toString(size.y()) + "x" + de::toString(size.z()));
}